

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator<<=(base_uint<256U> *this,uint shift)

{
  long lVar1;
  ulong uVar2;
  sbyte sVar3;
  int i;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  base_uint<256U> a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&a,this);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    this->pn[lVar4] = 0;
  }
  uVar2 = (ulong)(shift >> 5);
  sVar3 = (sbyte)(shift & 0x1f);
  lVar4 = 0;
  do {
    if (lVar4 == 8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return this;
      }
      __stack_chk_fail();
    }
    if (uVar2 + lVar4 < 7 && (shift & 0x1f) != 0) {
      uVar5 = a.pn[lVar4];
      this->pn[uVar2 + lVar4 + 1] = this->pn[uVar2 + lVar4 + 1] | uVar5 >> (0x20U - sVar3 & 0x1f);
LAB_00642f83:
      this->pn[uVar2 + lVar4] = this->pn[uVar2 + lVar4] | uVar5 << sVar3;
    }
    else if (uVar2 + lVar4 < 8) {
      uVar5 = a.pn[lVar4];
      goto LAB_00642f83;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator<<=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i + k + 1 < WIDTH && shift != 0)
            pn[i + k + 1] |= (a.pn[i] >> (32 - shift));
        if (i + k < WIDTH)
            pn[i + k] |= (a.pn[i] << shift);
    }
    return *this;
}